

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O0

int la_adsc_earth_air_ref_parse(void *dest,uint8_t *buf,uint32_t len)

{
  int iVar1;
  double *pdVar2;
  la_bitstream_t *bs_00;
  uint in_EDX;
  uint8_t *in_RSI;
  long in_RDI;
  double dVar3;
  char *unaff_retaddr;
  uint32_t tmp;
  la_bitstream_t *bs;
  la_adsc_earth_air_ref_t *r;
  la_adsc_tag_t *t;
  uint32_t tag_len;
  uint32_t in_stack_ffffffffffffffbc;
  uint32_t in_stack_ffffffffffffffc4;
  int local_4;
  
  if (in_EDX < 5) {
    local_4 = -1;
  }
  else {
    pdVar2 = (double *)la_xcalloc((size_t)t,(size_t)r,(char *)bs,tmp,unaff_retaddr);
    *(double **)(in_RDI + 0x10) = pdVar2;
    bs_00 = la_bitstream_init(in_stack_ffffffffffffffbc);
    iVar1 = la_bitstream_append_msbfirst(bs_00,in_RSI,5,8);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      iVar1 = la_bitstream_read_word_msbfirst(bs_00,(uint32_t *)&stack0xffffffffffffffc4,1);
      if (iVar1 < 0) {
        local_4 = -1;
      }
      else {
        *(char *)((long)pdVar2 + 0x14) = (char)in_stack_ffffffffffffffc4;
        iVar1 = la_bitstream_read_word_msbfirst(bs_00,(uint32_t *)&stack0xffffffffffffffc4,0xc);
        if (iVar1 < 0) {
          local_4 = -1;
        }
        else {
          dVar3 = la_adsc_heading_parse(in_stack_ffffffffffffffc4);
          *pdVar2 = dVar3;
          iVar1 = la_bitstream_read_word_msbfirst(bs_00,(uint32_t *)&stack0xffffffffffffffc4,0xd);
          if (iVar1 < 0) {
            local_4 = -1;
          }
          else {
            dVar3 = la_adsc_speed_parse(in_stack_ffffffffffffffc4);
            pdVar2[1] = dVar3;
            iVar1 = la_bitstream_read_word_msbfirst(bs_00,(uint32_t *)&stack0xffffffffffffffc4,0xc);
            if (iVar1 < 0) {
              local_4 = -1;
            }
            else {
              iVar1 = la_adsc_vert_speed_parse(in_stack_ffffffffffffffc4);
              *(int *)(pdVar2 + 2) = iVar1;
              la_bitstream_destroy((la_bitstream_t *)0x174071);
              local_4 = 5;
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

LA_ADSC_PARSER_FUN(la_adsc_earth_air_ref_parse) {
	uint32_t tag_len = 5;
	la_adsc_tag_t *t = dest;
	LA_ADSC_CHECK_LEN(t->tag, len, tag_len);
	LA_NEW(la_adsc_earth_air_ref_t, r);
	t->data = r;

	la_bitstream_t *bs = la_bitstream_init(tag_len * 8);
	if(la_bitstream_append_msbfirst(bs, buf, tag_len, 8) < 0) {
		return -1;
	}

	uint32_t tmp;
	LA_BS_READ_OR_RETURN(bs, &tmp, 1, -1);
	r->heading_invalid = tmp;
	LA_BS_READ_OR_RETURN(bs, &tmp, 12, -1);
	r->heading = la_adsc_heading_parse(tmp);
	LA_BS_READ_OR_RETURN(bs, &tmp, 13, -1);
	r->speed = la_adsc_speed_parse(tmp);
	LA_BS_READ_OR_RETURN(bs, &tmp, 12, -1);
	r->vert_speed = la_adsc_vert_speed_parse(tmp);

	la_bitstream_destroy(bs);
	return tag_len;
}